

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::genVertexAttribData
          (GeometryShaderRenderTest *this)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  pointer pVVar1;
  int i;
  long lVar2;
  ulong uVar3;
  undefined4 uVar4;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vec4 offset;
  float local_58 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined8 uStack_30;
  float local_28 [4];
  
  local_28[0] = -0.5;
  local_28[1] = -0.2;
  local_28[2] = 0.0;
  local_28[3] = 1.0;
  this_00 = &this->m_vertexPosData;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(this_00,0xc);
  local_38 = (undefined1 *)0x0;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1->m_data = local_48;
  *(undefined8 *)(pVVar1->m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0xbf800000bf800000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[1].m_data = local_48;
  *(undefined8 *)(pVVar1[1].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0xbf80000000000000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[2].m_data = local_48;
  *(undefined8 *)(pVVar1[2].m_data + 2) = uStack_40;
  local_38 = &DAT_3f8000003f800000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[3].m_data = local_48;
  *(undefined8 *)(pVVar1[3].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0x3f800000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[4].m_data = local_48;
  *(undefined8 *)(pVVar1[4].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0xc000000000000000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[5].m_data = local_48;
  *(undefined8 *)(pVVar1[5].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0xbf8000003f800000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[6].m_data = local_48;
  *(undefined8 *)(pVVar1[6].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0x3f80000040000000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[7].m_data = local_48;
  *(undefined8 *)(pVVar1[7].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0x40000000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[8].m_data = local_48;
  *(undefined8 *)(pVVar1[8].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0xc00000003f800000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[9].m_data = local_48;
  *(undefined8 *)(pVVar1[9].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0xbf80000040000000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this_00->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[10].m_data = local_48;
  *(undefined8 *)(pVVar1[10].m_data + 2) = uStack_40;
  local_38 = (undefined1 *)0x40400000;
  uStack_30 = 0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  lVar2 = 0;
  do {
    local_58[lVar2] = *(float *)((long)&local_38 + lVar2 * 4) * 0.3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_48 + lVar2 * 4) = local_58[lVar2] + local_28[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)pVVar1[0xb].m_data = local_48;
  *(undefined8 *)(pVVar1[0xb].m_data + 2) = uStack_40;
  lVar2 = 0xc;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_vertexAttrData,0xc);
  uVar3 = 0;
  do {
    uVar4 = 0x3f800000;
    if ((uVar3 & 1) != 0) {
      uVar4 = 0;
    }
    pVVar1 = (this->m_vertexAttrData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar1->m_data + lVar2 + -0xc) = 0x3f800000;
    *(undefined4 *)((long)pVVar1->m_data + lVar2 + -8) = uVar4;
    *(undefined4 *)((long)pVVar1->m_data + lVar2 + -4) = uVar4;
    *(undefined4 *)((long)pVVar1->m_data + lVar2) = 0x3f800000;
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x10;
  } while (uVar3 != 0xc);
  this->m_numDrawVertices = 0xc;
  return;
}

Assistant:

void GeometryShaderRenderTest::genVertexAttribData (void)
{
	// Create 1 X 2 grid in triangle strip adjacent - order
	const float scale = 0.3f;
	const tcu::Vec4 offset(-0.5f, -0.2f, 0.0f, 1.0f);

	m_vertexPosData.resize(12);
	m_vertexPosData[ 0] = tcu::Vec4( 0,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 1] = tcu::Vec4(-1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 2] = tcu::Vec4( 0, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 3] = tcu::Vec4( 1,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 4] = tcu::Vec4( 1,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 5] = tcu::Vec4( 0, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 6] = tcu::Vec4( 1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 7] = tcu::Vec4( 2,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 8] = tcu::Vec4( 2,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 9] = tcu::Vec4( 1, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[10] = tcu::Vec4( 2, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[11] = tcu::Vec4( 3,  0, 0.0f, 0.0f) * scale + offset;

	// Red and white
	m_vertexAttrData.resize(12);
	for (int i = 0; i < 12; ++i)
		m_vertexAttrData[i] = (i % 2 == 0) ? tcu::Vec4(1, 1, 1, 1) : tcu::Vec4(1, 0, 0, 1);

	m_numDrawVertices = 12;
}